

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O0

LogicalType * __thiscall duckdb::ArrowType::GetDuckType(ArrowType *this,bool use_dictionary)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  LogicalTypeId LVar4;
  ArrowStructInfo *pAVar5;
  idx_t iVar6;
  ArrowType *this_00;
  LogicalType *key;
  byte in_DL;
  ArrowTypeInfo *in_RSI;
  LogicalType *in_RDI;
  string *child_name_1;
  ArrowType *child_2;
  idx_t i_1;
  child_list_t<LogicalType> new_children_1;
  ArrowStructInfo *union_info;
  LogicalType struct_type;
  ArrowType *struct_child;
  ArrowListInfo *list_info_1;
  ArrowType *child_1;
  ArrowListInfo *list_info;
  string *child_name;
  ArrowType *child;
  idx_t i;
  child_list_t<LogicalType> new_children;
  ArrowStructInfo *struct_info;
  LogicalTypeId id;
  ArrowTypeExtensionData *in_stack_fffffffffffffd78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *in_stack_fffffffffffffd80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *in_stack_fffffffffffffd88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *__args;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *in_stack_fffffffffffffd90;
  LogicalType *in_stack_fffffffffffffdc8;
  child_list_t<LogicalType> *children;
  LogicalType *in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffe28;
  ulong local_170;
  child_list_t<LogicalType> local_c8 [4];
  string *local_60;
  ArrowType *local_58;
  ulong local_40;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 uVar7;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  
  bVar2 = in_DL & 1;
  if (bVar2 != 0) {
    bVar3 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
                       0x1a22c70);
    uVar7 = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
    if (bVar3) {
      unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                 in_stack_fffffffffffffd80);
      GetDuckType((ArrowType *)
                  CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)),
                  (bool)uVar7);
      return in_RDI;
    }
  }
  if ((bVar2 & 1) == 0) {
    bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                      ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1a22cb5);
    if (bVar3) {
      shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->
                ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffffd80);
      ArrowTypeExtensionData::GetDuckDBType(in_stack_fffffffffffffd78);
    }
    else {
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
    }
  }
  else {
    LVar4 = LogicalType::id((LogicalType *)(in_RSI + 1));
    uVar7 = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
    key = (LogicalType *)(ulong)(byte)(LVar4 + 0x9c);
    switch(key) {
    case (LogicalType *)0x0:
      unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
      operator->((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                  *)in_stack_fffffffffffffd80);
      pAVar5 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(in_RSI);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)0x1a22d75);
      for (local_40 = 0; uVar1 = local_40,
          iVar6 = ArrowStructInfo::ChildCount((ArrowStructInfo *)0x1a22d9b), uVar1 < iVar6;
          local_40 = local_40 + 1) {
        local_58 = ArrowStructInfo::GetChild
                             ((ArrowStructInfo *)in_stack_fffffffffffffd80,
                              (idx_t)in_stack_fffffffffffffd78);
        local_60 = StructType::GetChildName_abi_cxx11_
                             ((LogicalType *)in_stack_fffffffffffffd80,
                              (idx_t)in_stack_fffffffffffffd78);
        GetDuckType((ArrowType *)CONCAT17(bVar2,CONCAT16(LVar4,in_stack_ffffffffffffffe8)),
                    SUB81((ulong)pAVar5 >> 0x38,0));
        ::std::make_pair<std::__cxx11::string_const&,duckdb::LogicalType>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd88,(LogicalType *)in_stack_fffffffffffffd80);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::~pair(in_stack_fffffffffffffd80);
        LogicalType::~LogicalType((LogicalType *)0x1a22e81);
      }
      children = local_c8;
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)in_stack_fffffffffffffd80,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)in_stack_fffffffffffffd78);
      LogicalType::STRUCT(children);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x1a22f34);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x1a22f41);
      break;
    case (LogicalType *)0x1:
      unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
      operator->((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                  *)in_stack_fffffffffffffd80);
      ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(in_RSI);
      ArrowListInfo::GetChild((ArrowListInfo *)0x1a22fa7);
      GetDuckType((ArrowType *)CONCAT17(bVar2,CONCAT16(LVar4,in_stack_ffffffffffffffe8)),(bool)uVar7
                 );
      LogicalType::LIST(in_stack_fffffffffffffdc8);
      LogicalType::~LogicalType((LogicalType *)0x1a22fef);
      break;
    case (LogicalType *)0x2:
      unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
      operator->((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                  *)in_stack_fffffffffffffd80);
      ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(in_RSI);
      ArrowListInfo::GetChild((ArrowListInfo *)0x1a23048);
      GetDuckType((ArrowType *)CONCAT17(bVar2,CONCAT16(LVar4,in_stack_ffffffffffffffe8)),(bool)uVar7
                 );
      StructType::GetChildType
                ((LogicalType *)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
      StructType::GetChildType
                ((LogicalType *)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
      LogicalType::MAP(key,in_stack_fffffffffffffdf0);
      LogicalType::~LogicalType((LogicalType *)0x1a230f1);
      LogicalType::~LogicalType((LogicalType *)0x1a230fe);
      LogicalType::~LogicalType((LogicalType *)0x1a2310b);
      break;
    default:
      bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                        ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1a233b3);
      if (bVar3) {
        shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->
                  ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffffd80);
        ArrowTypeExtensionData::GetDuckDBType(in_stack_fffffffffffffd78);
      }
      else {
        LogicalType::LogicalType
                  ((LogicalType *)in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78
                  );
      }
      break;
    case (LogicalType *)0x7:
      unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
      operator->((unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                  *)in_stack_fffffffffffffd80);
      ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(in_RSI);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)0x1a231aa);
      for (local_170 = 0; iVar6 = ArrowStructInfo::ChildCount((ArrowStructInfo *)0x1a231d0),
          local_170 < iVar6; local_170 = local_170 + 1) {
        this_00 = ArrowStructInfo::GetChild
                            ((ArrowStructInfo *)in_stack_fffffffffffffd80,
                             (idx_t)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffd80 =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)UnionType::GetMemberName_abi_cxx11_
                          ((LogicalType *)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78
                          );
        __args = in_stack_fffffffffffffd80;
        GetDuckType((ArrowType *)CONCAT17(bVar2,CONCAT16(LVar4,in_stack_ffffffffffffffe8)),
                    SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x38,0));
        ::std::make_pair<std::__cxx11::string_const&,duckdb::LogicalType>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                   (LogicalType *)in_stack_fffffffffffffd80);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)this_00,__args);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::~pair(in_stack_fffffffffffffd80);
        LogicalType::~LogicalType((LogicalType *)0x1a232b6);
      }
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)in_stack_fffffffffffffd80,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)&stack0xfffffffffffffe18);
      LogicalType::UNION((child_list_t<LogicalType> *)in_stack_fffffffffffffe28);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x1a23367);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x1a23374);
    }
  }
  return in_RDI;
}

Assistant:

LogicalType ArrowType::GetDuckType(bool use_dictionary) const {
	if (use_dictionary && dictionary_type) {
		return dictionary_type->GetDuckType();
	}
	if (!use_dictionary) {
		if (extension_data) {
			return extension_data->GetDuckDBType();
		}
		return type;
	}
	// Dictionaries can exist in arbitrarily nested schemas
	// have to reconstruct the type
	auto id = type.id();
	switch (id) {
	case LogicalTypeId::STRUCT: {
		auto &struct_info = type_info->Cast<ArrowStructInfo>();
		child_list_t<LogicalType> new_children;
		for (idx_t i = 0; i < struct_info.ChildCount(); i++) {
			auto &child = struct_info.GetChild(i);
			auto &child_name = StructType::GetChildName(type, i);
			new_children.emplace_back(std::make_pair(child_name, child.GetDuckType(true)));
		}
		return LogicalType::STRUCT(std::move(new_children));
	}
	case LogicalTypeId::LIST: {
		auto &list_info = type_info->Cast<ArrowListInfo>();
		auto &child = list_info.GetChild();
		return LogicalType::LIST(child.GetDuckType(true));
	}
	case LogicalTypeId::MAP: {
		auto &list_info = type_info->Cast<ArrowListInfo>();
		auto &struct_child = list_info.GetChild();
		auto struct_type = struct_child.GetDuckType(true);
		return LogicalType::MAP(StructType::GetChildType(struct_type, 0), StructType::GetChildType(struct_type, 1));
	}
	case LogicalTypeId::UNION: {
		auto &union_info = type_info->Cast<ArrowStructInfo>();
		child_list_t<LogicalType> new_children;
		for (idx_t i = 0; i < union_info.ChildCount(); i++) {
			auto &child = union_info.GetChild(i);
			auto &child_name = UnionType::GetMemberName(type, i);
			new_children.emplace_back(std::make_pair(child_name, child.GetDuckType(true)));
		}
		return LogicalType::UNION(std::move(new_children));
	}
	default: {
		if (extension_data) {
			return extension_data->GetDuckDBType();
		}
		return type;
	}
	}
}